

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCRgbaFile.cpp
# Opt level: O1

int ImfTiledOutputSetFrameBuffer
              (ImfTiledOutputFile *out,ImfRgba *base,size_t xStride,size_t yStride)

{
  Imf_3_4::TiledRgbaOutputFile::setFrameBuffer
            ((TiledRgbaOutputFile *)out,(Rgba *)base,xStride,yStride);
  return 1;
}

Assistant:

int
ImfTiledOutputSetFrameBuffer (
    ImfTiledOutputFile* out,
    const ImfRgba*      base,
    size_t              xStride,
    size_t              yStride)
{
    try
    {
        outfile (out)->setFrameBuffer (
            (OPENEXR_IMF_INTERNAL_NAMESPACE::Rgba*) base, xStride, yStride);
        return 1;
    }
    catch (const std::exception& e)
    {
        setErrorMessage (e);
        return 0;
    }
}